

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O2

void __thiscall Imf_3_4::TimeCode::setMinutes(TimeCode *this,int value)

{
  ArgExc *this_00;
  
  if ((uint)value < 0x3c) {
    this->_time = (uint)(byte)((char)value + (char)(((ushort)value & 0xff) / 10) * '\x06') << 0x10 |
                  this->_time & 0xff80ffff;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc
            (this_00,"Cannot set minutes field in time code. New value is out of range.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setMinutes (int value)
{
    if (value < 0 || value > 59)
        throw IEX_NAMESPACE::ArgExc ("Cannot set minutes field in time code. "
                                     "New value is out of range.");

    setBitField (_time, 16, 22, binaryToBcd (value));
}